

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmCommonTargetGenerator::GetFortranModuleDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  pointer pcVar1;
  long *local_38 [2];
  long local_28 [2];
  
  if (this->FortranModuleDirectoryComputed == false) {
    this->FortranModuleDirectoryComputed = true;
    (*this->_vptr_cmCommonTargetGenerator[2])(local_38,this);
    std::__cxx11::string::operator=((string *)&this->FortranModuleDirectory,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->FortranModuleDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->FortranModuleDirectory)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetFortranModuleDirectory()
{
  // Compute the module directory.
  if(!this->FortranModuleDirectoryComputed)
    {
    this->FortranModuleDirectoryComputed = true;
    this->FortranModuleDirectory = this->ComputeFortranModuleDirectory();
    }

  // Return the computed directory.
  return this->FortranModuleDirectory;
}